

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update_extensions.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalUpdateExtensions::GetData
          (PhysicalUpdateExtensions *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  idx_t iVar1;
  GlobalSourceState *pGVar2;
  pointer pcVar3;
  long lVar4;
  reference pvVar5;
  char *pcVar6;
  ulong uVar7;
  ulong __n;
  ulong index;
  bool bVar8;
  allocator local_119;
  GlobalSourceState *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  Value local_70;
  
  pGVar2 = input->global_state;
  __n = *(ulong *)((long)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
                  8);
  bVar8 = true;
  if (__n < (ulong)((*(long *)&pGVar2[1].super_StateWithBlockableTasks -
                     (long)pGVar2[1]._vptr_GlobalSourceState >> 3) * -0x30c30c30c30c30c3)) {
    local_118 = pGVar2 + 1;
    index = 0;
    do {
      pvVar5 = vector<duckdb::ExtensionUpdateResult,_true>::operator[]
                         ((vector<duckdb::ExtensionUpdateResult,_true> *)local_118,__n);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar3 = (pvVar5->extension_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,pcVar3 + (pvVar5->extension_name)._M_string_length);
      Value::Value(&local_70,&local_b0);
      DataChunk::SetValue(chunk,0,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar3 = (pvVar5->repository)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,pcVar3 + (pvVar5->repository)._M_string_length);
      Value::Value(&local_70,&local_d0);
      DataChunk::SetValue(chunk,1,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      pcVar6 = EnumUtil::ToChars<duckdb::ExtensionUpdateResultTag>(pvVar5->tag);
      ::std::__cxx11::string::string((string *)&local_90,pcVar6,&local_119);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(chunk,2,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar3 = (pvVar5->prev_version)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar3,pcVar3 + (pvVar5->prev_version)._M_string_length);
      Value::Value(&local_70,&local_f0);
      DataChunk::SetValue(chunk,3,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar3 = (pvVar5->installed_version)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,pcVar3 + (pvVar5->installed_version)._M_string_length);
      Value::Value(&local_70,&local_110);
      DataChunk::SetValue(chunk,4,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      lVar4 = *(long *)&pGVar2[1].super_StateWithBlockableTasks;
      __n = *(long *)((long)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base.
                             _M_mutex + 8) + 1;
      *(ulong *)((long)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8
                ) = __n;
      iVar1 = index + 1;
      uVar7 = (lVar4 - (long)pGVar2[1]._vptr_GlobalSourceState >> 3) * -0x30c30c30c30c30c3;
    } while ((__n < uVar7) && (bVar8 = index < 0x7ff, index = iVar1, bVar8));
    chunk->count = iVar1;
    bVar8 = uVar7 <= __n;
  }
  return bVar8;
}

Assistant:

SourceResultType PhysicalUpdateExtensions::GetData(ExecutionContext &context, DataChunk &chunk,
                                                   OperatorSourceInput &input) const {
	auto &data = input.global_state.Cast<UpdateExtensionsGlobalState>();

	if (data.offset >= data.update_result_entries.size()) {
		// finished returning values
		return SourceResultType::FINISHED;
	}

	idx_t count = 0;
	while (data.offset < data.update_result_entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.update_result_entries[data.offset];

		// return values:
		idx_t col = 0;
		// extension_name LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.extension_name));
		// repository LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.repository));
		// update_result
		chunk.SetValue(col++, count, Value(EnumUtil::ToString(entry.tag)));
		// previous_version LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.prev_version));
		// current_version LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.installed_version));

		data.offset++;
		count++;
	}
	chunk.SetCardinality(count);

	return data.offset >= data.update_result_entries.size() ? SourceResultType::FINISHED
	                                                        : SourceResultType::HAVE_MORE_OUTPUT;
}